

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeoIPCity.c
# Opt level: O1

int GeoIP_record_id_by_addr(GeoIP *gi,char *addr)

{
  uint uVar1;
  unsigned_long ipnum;
  
  if ((byte)(gi->databaseType | 4U) == 6) {
    if (addr != (char *)0x0) {
      ipnum = _GeoIP_addr_to_num(addr);
      uVar1 = _GeoIP_seek_record(gi,ipnum);
      return uVar1;
    }
  }
  else {
    printf("Invalid database type %s, expected %s\n",GeoIPDBDescription[gi->databaseType],
           GeoIPDBDescription[2]);
  }
  return 0;
}

Assistant:

int GeoIP_record_id_by_addr (GeoIP* gi, const char *addr) {
	unsigned long ipnum;
	if (gi->databaseType != GEOIP_CITY_EDITION_REV0 &&
			gi->databaseType != GEOIP_CITY_EDITION_REV1) {
		printf("Invalid database type %s, expected %s\n", GeoIPDBDescription[(int)gi->databaseType], GeoIPDBDescription[GEOIP_CITY_EDITION_REV1]);
		return 0;
	}
	if (addr == NULL) {
		return 0;
	}
	ipnum = _GeoIP_addr_to_num(addr);
	return _GeoIP_seek_record(gi, ipnum);
}